

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O1

int run_test_idle_ref(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 extraout_RAX;
  undefined8 in_R9;
  uv_idle_t h;
  uv_idle_t local_80;
  
  puVar2 = uv_default_loop();
  uv_idle_init(puVar2,&local_80);
  uv_idle_start(&local_80,fail_cb2);
  uv_unref((uv_handle_t *)&local_80);
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  do_close(&local_80);
  puVar2 = uv_default_loop();
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  uv_run(puVar2,UV_RUN_DEFAULT);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    return 0;
  }
  run_test_idle_ref_cold_1();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
          ,0x3e,"0 && \"fail_cb2 should not have been called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

TEST_IMPL(idle_ref) {
  uv_idle_t h;
  uv_idle_init(uv_default_loop(), &h);
  uv_idle_start(&h, (uv_idle_cb) fail_cb2);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY();
  return 0;
}